

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O0

NULLCArray __thiscall
NULLCPugiXML::xml_node__child_value1(NULLCPugiXML *this,NULLCArray name,xml_node *ptr)

{
  NULLCArray NVar1;
  size_t sVar2;
  xml_node *ptr_local;
  NULLCArray name_local;
  NULLCArray ret;
  
  name_local.ptr._0_4_ = name.ptr._0_4_;
  if (this == (NULLCPugiXML *)0x0) {
    nullcThrowError("name is empty");
    memset((void *)((long)&name_local.ptr + 4),0,0xc);
  }
  else {
    name_local._4_8_ =
         pugi::xml_node::child_value
                   ((xml_node *)CONCAT44((int)((ulong)register0x00000010 >> 0x20),name.len),
                    (char_t *)this);
    sVar2 = strlen((char *)name_local._4_8_);
    ret.ptr._0_4_ = (int)sVar2 + 1;
  }
  NVar1.len = (uint)ret.ptr;
  NVar1.ptr = (char *)name_local._4_8_;
  return NVar1;
}

Assistant:

NULLCArray xml_node__child_value1(NULLCArray name, xml_node* ptr)
	{
		if(!name.ptr)
		{
			nullcThrowError("name is empty");
			return NULLCArray();
		}
		NULLCArray ret;
		ret.ptr = (pugi::char_t*)ptr->node.child_value(name.ptr);
		ret.len = (unsigned)strlen(ret.ptr) + 1;
		return ret;
	}